

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestForeignNested::_InternalSerialize
          (TestForeignNested *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestAllTypes_NestedMessage *value;
  ulong uVar1;
  uint8_t *puVar2;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    value = (this->field_0)._impl_.foreign_nested_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (1,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestForeignNested::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestForeignNested& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestForeignNested)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.TestAllTypes.NestedMessage foreign_nested = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.foreign_nested_, this_._impl_.foreign_nested_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestForeignNested)
  return target;
}